

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  Mat *m;
  Mat *this_00;
  size_t sVar5;
  pointer pMVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong uVar14;
  void *pvVar15;
  uint uVar16;
  void *pvVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar3 = m->c;
  uVar19 = (ulong)uVar3;
  uVar16 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  pvVar15 = this_00->data;
  if (pvVar15 == (void *)0x0) {
    return -100;
  }
  sVar5 = this_00->cstep;
  if ((long)this_00->c * sVar5 == 0) {
    return -100;
  }
  iVar4 = this->op_type;
  if (iVar4 == 2) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)uVar3) {
      pvVar17 = m->data;
      sVar7 = m->cstep;
      pvVar18 = pMVar6[1].data;
      sVar8 = pMVar6[1].cstep;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].elemsize;
      sVar11 = m->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar13 = 0;
          do {
            fVar22 = *(float *)((long)pvVar18 + uVar13 * 4);
            fVar1 = *(float *)((long)pvVar17 + uVar13 * 4);
            if (fVar22 <= fVar1) {
              fVar22 = fVar1;
            }
            *(float *)((long)pvVar15 + uVar13 * 4) = fVar22;
            uVar13 = uVar13 + 1;
          } while (uVar16 != uVar13);
        }
        uVar21 = uVar21 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar5);
        pvVar18 = (void *)((long)pvVar18 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar7 * sVar11);
      } while (uVar21 != uVar19);
    }
    uVar21 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
             -0x71c71c71c71c71c7;
    if (uVar21 < 3) {
      return 0;
    }
    uVar13 = 2;
    do {
      if (0 < (int)uVar3) {
        pvVar15 = pMVar6[uVar13].data;
        sVar7 = pMVar6[uVar13].cstep;
        sVar8 = pMVar6[uVar13].elemsize;
        pvVar17 = this_00->data;
        sVar9 = this_00->elemsize;
        uVar20 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar14 = 0;
            do {
              fVar22 = *(float *)((long)pvVar15 + uVar14 * 4);
              fVar1 = *(float *)((long)pvVar17 + uVar14 * 4);
              if (fVar22 <= fVar1) {
                fVar22 = fVar1;
              }
              *(float *)((long)pvVar17 + uVar14 * 4) = fVar22;
              uVar14 = uVar14 + 1;
            } while (uVar16 != uVar14);
          }
          uVar20 = uVar20 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar7 * sVar8);
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar5);
        } while (uVar20 != uVar19);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar21);
  }
  else {
    if (iVar4 == 1) {
      if ((this->coeffs).w != 0) {
        puVar12 = (undefined8 *)(this->coeffs).data;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < (int)uVar3) {
          uVar2 = *puVar12;
          pvVar17 = m->data;
          sVar7 = m->cstep;
          pvVar18 = pMVar6[1].data;
          sVar8 = pMVar6[1].cstep;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = m->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar13 = 0;
              do {
                *(float *)((long)pvVar15 + uVar13 * 4) =
                     *(float *)((long)pvVar18 + uVar13 * 4) * (float)((ulong)uVar2 >> 0x20) +
                     *(float *)((long)pvVar17 + uVar13 * 4) * (float)uVar2;
                uVar13 = uVar13 + 1;
              } while (uVar16 != uVar13);
            }
            uVar21 = uVar21 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar5);
            pvVar18 = (void *)((long)pvVar18 + sVar8 * sVar10);
            pvVar17 = (void *)((long)pvVar17 + sVar7 * sVar11);
          } while (uVar21 != uVar19);
        }
        uVar21 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
                 -0x71c71c71c71c71c7;
        if (uVar21 < 3) {
          return 0;
        }
        uVar13 = 2;
        do {
          if (0 < (int)uVar3) {
            fVar22 = *(float *)((long)puVar12 + uVar13 * 4);
            pvVar15 = pMVar6[uVar13].data;
            sVar7 = pMVar6[uVar13].cstep;
            sVar8 = pMVar6[uVar13].elemsize;
            pvVar17 = this_00->data;
            sVar9 = this_00->elemsize;
            uVar20 = 0;
            do {
              if (0 < (int)uVar16) {
                uVar14 = 0;
                do {
                  *(float *)((long)pvVar17 + uVar14 * 4) =
                       *(float *)((long)pvVar15 + uVar14 * 4) * fVar22 +
                       *(float *)((long)pvVar17 + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while (uVar16 != uVar14);
              }
              uVar20 = uVar20 + 1;
              pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar5);
              pvVar15 = (void *)((long)pvVar15 + sVar7 * sVar8);
            } while (uVar20 != uVar19);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar21);
        return 0;
      }
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)uVar3) {
        pvVar17 = m->data;
        sVar7 = m->cstep;
        pvVar18 = pMVar6[1].data;
        sVar8 = pMVar6[1].cstep;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6[1].elemsize;
        sVar11 = m->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar13 = 0;
            do {
              *(float *)((long)pvVar15 + uVar13 * 4) =
                   *(float *)((long)pvVar18 + uVar13 * 4) + *(float *)((long)pvVar17 + uVar13 * 4);
              uVar13 = uVar13 + 1;
            } while (uVar16 != uVar13);
          }
          uVar21 = uVar21 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar5);
          pvVar18 = (void *)((long)pvVar18 + sVar8 * sVar10);
          pvVar17 = (void *)((long)pvVar17 + sVar7 * sVar11);
        } while (uVar21 != uVar19);
      }
      uVar21 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar21 < 3) {
        return 0;
      }
      uVar13 = 2;
      do {
        if (0 < (int)uVar3) {
          pvVar15 = pMVar6[uVar13].data;
          sVar7 = pMVar6[uVar13].cstep;
          sVar8 = pMVar6[uVar13].elemsize;
          pvVar17 = this_00->data;
          sVar9 = this_00->elemsize;
          uVar20 = 0;
          do {
            if (0 < (int)uVar16) {
              uVar14 = 0;
              do {
                *(float *)((long)pvVar17 + uVar14 * 4) =
                     *(float *)((long)pvVar17 + uVar14 * 4) + *(float *)((long)pvVar15 + uVar14 * 4)
                ;
                uVar14 = uVar14 + 1;
              } while (uVar16 != uVar14);
            }
            uVar20 = uVar20 + 1;
            pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar5);
            pvVar15 = (void *)((long)pvVar15 + sVar7 * sVar8);
          } while (uVar20 != uVar19);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar21);
      return 0;
    }
    if (iVar4 != 0) {
      return 0;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)uVar3) {
      pvVar17 = m->data;
      sVar7 = m->cstep;
      pvVar18 = pMVar6[1].data;
      sVar8 = pMVar6[1].cstep;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].elemsize;
      sVar11 = m->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar16) {
          uVar13 = 0;
          do {
            *(float *)((long)pvVar15 + uVar13 * 4) =
                 *(float *)((long)pvVar18 + uVar13 * 4) * *(float *)((long)pvVar17 + uVar13 * 4);
            uVar13 = uVar13 + 1;
          } while (uVar16 != uVar13);
        }
        uVar21 = uVar21 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar9 * sVar5);
        pvVar18 = (void *)((long)pvVar18 + sVar8 * sVar10);
        pvVar17 = (void *)((long)pvVar17 + sVar7 * sVar11);
      } while (uVar21 != uVar19);
    }
    uVar21 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3) *
             -0x71c71c71c71c71c7;
    if (uVar21 < 3) {
      return 0;
    }
    uVar13 = 2;
    do {
      if (0 < (int)uVar3) {
        pvVar15 = pMVar6[uVar13].data;
        sVar7 = pMVar6[uVar13].cstep;
        sVar8 = pMVar6[uVar13].elemsize;
        pvVar17 = this_00->data;
        sVar9 = this_00->elemsize;
        uVar20 = 0;
        do {
          if (0 < (int)uVar16) {
            uVar14 = 0;
            do {
              *(float *)((long)pvVar17 + uVar14 * 4) =
                   *(float *)((long)pvVar17 + uVar14 * 4) * *(float *)((long)pvVar15 + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar16 != uVar14);
          }
          uVar20 = uVar20 + 1;
          pvVar17 = (void *)((long)pvVar17 + sVar9 * sVar5);
          pvVar15 = (void *)((long)pvVar15 + sVar7 * sVar8);
        } while (uVar20 != uVar19);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar21);
  }
  return 0;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}